

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSubcommandTable.cxx
# Opt level: O1

bool __thiscall
cmSubcommandTable::operator()
          (cmSubcommandTable *this,string_view key,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *status)

{
  pointer ppVar1;
  size_t __n;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  char *__s2;
  ulong __n_00;
  pointer ppVar5;
  ulong uVar6;
  difference_type __d;
  ulong uVar7;
  long lVar8;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string local_70;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  ulong local_40;
  char *local_38;
  
  __s2 = key._M_str;
  uVar6 = key._M_len;
  ppVar5 = (this->Impl).
           super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (this->Impl).
           super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar4 = (long)ppVar1 - (long)ppVar5;
  if (0 < (long)uVar4) {
    uVar4 = (uVar4 >> 3) * -0x5555555555555555;
    do {
      uVar7 = uVar4 >> 1;
      __n_00 = ppVar5[uVar7].first._M_len;
      lVar8 = __n_00 - uVar6;
      if (uVar6 <= __n_00) {
        __n_00 = uVar6;
      }
      if (__n_00 == 0) {
        iVar3 = 0;
      }
      else {
        iVar3 = memcmp(ppVar5[uVar7].first._M_str,__s2,__n_00);
      }
      if (iVar3 == 0) {
        if (lVar8 < -0x7fffffff) {
          lVar8 = -0x80000000;
        }
        if (0x7ffffffe < lVar8) {
          lVar8 = 0x7fffffff;
        }
        iVar3 = (int)lVar8;
      }
      if (iVar3 < 0) {
        ppVar5 = ppVar5 + uVar7 + 1;
        uVar7 = ~uVar7 + uVar4;
      }
      uVar4 = uVar7;
    } while (0 < (long)uVar7);
  }
  if ((ppVar5 != ppVar1) && (__n = (ppVar5->first)._M_len, __n == uVar6)) {
    if (__n != 0) {
      iVar3 = bcmp((ppVar5->first)._M_str,__s2,__n);
      if (iVar3 != 0) goto LAB_002cb9b1;
    }
    bVar2 = (*ppVar5->second)(args,status);
    return bVar2;
  }
LAB_002cb9b1:
  local_50._M_len = 0x1f;
  local_50._M_str = "does not recognize sub-command ";
  views._M_len = 2;
  views._M_array = &local_50;
  local_40 = uVar6;
  local_38 = __s2;
  cmCatViews_abi_cxx11_(&local_70,views);
  std::__cxx11::string::_M_assign((string *)&status->Error);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  return false;
}

Assistant:

bool cmSubcommandTable::operator()(cm::string_view key,
                                   std::vector<std::string> const& args,
                                   cmExecutionStatus& status) const
{
  auto const it = std::lower_bound(
    this->Impl.begin(), this->Impl.end(), key,
    [](Elem const& elem, cm::string_view k) { return elem.first < k; });
  if (it != this->Impl.end() && it->first == key) {
    return it->second(args, status);
  }
  status.SetError(cmStrCat("does not recognize sub-command ", key));
  return false;
}